

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_ObjSimRsb(Gia_SimRsbMan_t *p,int iObj,int nCands,int fVerbose,int *pnBufs,int *pnInvs)

{
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  word *pwVar6;
  long lVar7;
  word *pwVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int local_54;
  word **local_48;
  
  pVVar5 = Gia_SimRsbTfo(p,iObj,-1);
  pwVar6 = Gia_SimRsbCareSet(p,iObj,pVVar5);
  uVar2 = p->nWords * iObj;
  if ((-1 < (int)uVar2) && ((int)uVar2 < p->vSimsObj->nSize)) {
    pwVar8 = p->vSimsObj->pArray;
    pVVar5 = Gia_ObjSimCands(p,iObj,nCands);
    lVar7 = (long)p->nWords;
    if (0 < lVar7) {
      pwVar1 = p->pFunc[0];
      lVar9 = 0;
      do {
        pwVar1[lVar9] = ~pwVar8[(ulong)uVar2 + lVar9] & pwVar6[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
      pwVar1 = p->pFunc[1];
      lVar9 = 0;
      do {
        pwVar1[lVar9] = pwVar8[(ulong)uVar2 + lVar9] & pwVar6[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
    }
    local_48 = p->pFunc + 1;
    if (pVVar5->nSize < 1) {
      local_54 = 0;
    }
    else {
      lVar7 = 0;
      local_54 = 0;
      do {
        uVar2 = pVVar5->pArray[lVar7];
        uVar4 = p->nWords;
        uVar3 = uVar4 * uVar2;
        if (((int)uVar3 < 0) || (p->vSimsObj->nSize <= (int)uVar3)) goto LAB_007c38a0;
        pwVar6 = p->vSimsObj->pArray;
        pwVar8 = p->pFunc[0];
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            if ((pwVar6[uVar3 + uVar10] & pwVar8[uVar10]) != 0) goto LAB_007c37f5;
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
          uVar10 = 0;
          do {
            if (((*local_48)[uVar10] & ~pwVar6[uVar3 + uVar10]) != 0) goto LAB_007c37f5;
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        *pnBufs = *pnBufs + 1;
        local_54 = 1;
        if (fVerbose != 0) {
          uVar4 = Gia_ObjLevelId((Gia_Man_t *)p->pGia->vLevels,iObj);
          printf("Level %3d : %d = buf(%d)\n",(ulong)uVar4,(ulong)(uint)iObj,(ulong)uVar2);
          pwVar8 = p->pFunc[0];
        }
LAB_007c37f5:
        lVar9 = (long)p->nWords;
        if (0 < lVar9) {
          lVar11 = 0;
          do {
            if ((pwVar8[lVar11] & ~pwVar6[(ulong)uVar3 + lVar11]) != 0) goto LAB_007c3873;
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
          lVar11 = 0;
          do {
            if ((pwVar6[(ulong)uVar3 + lVar11] & (*local_48)[lVar11]) != 0) goto LAB_007c3873;
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
        }
        *pnInvs = *pnInvs + 1;
        local_54 = 1;
        if (fVerbose != 0) {
          uVar4 = Gia_ObjLevelId((Gia_Man_t *)p->pGia->vLevels,iObj);
          printf("Level %3d : %d = inv(%d)\n",(ulong)uVar4,(ulong)(uint)iObj,(ulong)uVar2);
        }
LAB_007c3873:
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar5->nSize);
    }
    return local_54;
  }
LAB_007c38a0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ObjSimRsb( Gia_SimRsbMan_t * p, int iObj, int nCands, int fVerbose, int * pnBufs, int * pnInvs )
{
    int i, iCand, RetValue = 0;
    Vec_Int_t * vTfo   = Gia_SimRsbTfo( p, iObj, -1 );
    word * pCareSet    = Gia_SimRsbCareSet( p, iObj, vTfo );
    word * pFunc       = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    Vec_Int_t * vCands = Gia_ObjSimCands( p, iObj, nCands );
    Abc_TtAndSharp( p->pFunc[0], pCareSet, pFunc, p->nWords, 1 );
    Abc_TtAndSharp( p->pFunc[1], pCareSet, pFunc, p->nWords, 0 );

/*
printf( "Considering node %d with %d candidates:\n", iObj, Vec_IntSize(vCands) );
Vec_IntPrint( vTfo );
Vec_IntPrint( vCands );
Extra_PrintBinary( stdout, (unsigned *)pCareSet,    64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)pFunc,       64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[0], 64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[1], 64 );  printf( "\n" );
*/
    Vec_IntForEachEntry( vCands, iCand, i )
    {
        word * pDiv = Vec_WrdEntryP( p->vSimsObj, p->nWords*iCand );
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 0) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 1) )
            { (*pnBufs)++; if ( fVerbose ) printf( "Level %3d : %d = buf(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 1) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 0) )
            { (*pnInvs)++; if ( fVerbose ) printf( "Level %3d : %d = inv(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
    }
    return RetValue;
}